

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<const_char_*>,_testing::internal::CastAndAppendTransform<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>_>
::IterateOverTuple<std::tuple<const_char_*>,_1UL>::operator()
          (undefined8 param_1,undefined8 param_2,
          vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>
          *param_3)

{
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  MStack_28;
  
  MatcherCastImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*>
  ::CastImpl<true>(&MStack_28);
  std::
  vector<testing::Matcher<std::__cxx11::string_const&>,std::allocator<testing::Matcher<std::__cxx11::string_const&>>>
  ::emplace_back<testing::Matcher<std::__cxx11::string_const&>>
            (param_3,(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&MStack_28);
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&MStack_28);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>_>
          )(vector<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::allocator<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_>_>
            *)param_3;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }